

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTransactionManager::CheckpointDecision::CheckpointDecision
          (CheckpointDecision *this,string *reason_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->can_checkpoint = false;
  paVar1 = &(this->reason).field_2;
  (this->reason)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (reason_p->_M_dataplus)._M_p;
  paVar2 = &reason_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&reason_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->reason).field_2 + 8) = uVar4;
  }
  else {
    (this->reason)._M_dataplus._M_p = pcVar3;
    (this->reason).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->reason)._M_string_length = reason_p->_M_string_length;
  (reason_p->_M_dataplus)._M_p = (pointer)paVar2;
  reason_p->_M_string_length = 0;
  (reason_p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

DuckTransactionManager::CheckpointDecision::CheckpointDecision(string reason_p)
    : can_checkpoint(false), reason(std::move(reason_p)) {
}